

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

void pnga_access_ghost_element_ptr(Integer g_a,void *ptr,Integer *subscript,Integer *ld)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer IVar6;
  ulong uVar7;
  Integer IVar8;
  int iVar9;
  long lVar10;
  C_Integer CVar11;
  int _ndim;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer tmp_sub [7];
  int local_108 [8];
  long local_e8 [8];
  long local_a8 [7];
  long alStack_70 [8];
  
  lVar1 = g_a + 1000;
  IVar6 = pnga_nodeid();
  pgVar5 = GA;
  uVar2 = GA[lVar1].ndim;
  uVar12 = (ulong)(short)uVar2;
  if (0 < (long)uVar12) {
    uVar7 = 0;
    do {
      alStack_70[uVar7 + 1] = subscript[uVar7] + -1;
      uVar7 = uVar7 + 1;
    } while (uVar12 != uVar7);
  }
  iVar9 = GA[lVar1].distr_type;
  if (iVar9 - 1U < 3) {
    uVar7 = (long)(int)IVar6 % GA[lVar1].num_blocks[0];
    local_108[0] = (int)uVar7;
    if (1 < (short)uVar2) {
      uVar7 = uVar7 & 0xffffffff;
      lVar15 = 0;
      IVar8 = IVar6;
      do {
        IVar8 = (long)((int)IVar8 - (int)uVar7) / GA[g_a + 1000].num_blocks[lVar15];
        uVar7 = (long)(int)IVar8 % GA[g_a + 1000].num_blocks[lVar15 + 1];
        local_108[lVar15 + 1] = (int)uVar7;
        lVar15 = lVar15 + 1;
      } while ((uVar12 & 0xffffffff) - 1 != lVar15);
    }
    if (0 < (short)uVar2) {
      lVar15 = 0;
      do {
        iVar9 = *(int *)((long)local_108 + lVar15);
        lVar10 = *(long *)((long)GA[g_a + 1000].block_dims + lVar15 * 2);
        *(long *)((long)local_a8 + lVar15 * 2) = lVar10 * iVar9 + 1;
        lVar10 = ((long)iVar9 + 1) * lVar10;
        *(long *)((long)local_e8 + lVar15 * 2) = lVar10;
        lVar13 = *(long *)((long)GA[g_a + 1000].dims + lVar15 * 2);
        if (lVar13 <= lVar10) {
          lVar10 = lVar13;
        }
        *(long *)((long)local_e8 + lVar15 * 2) = lVar10;
        lVar15 = lVar15 + 4;
      } while ((uVar12 & 0xffffffff) << 2 != lVar15);
    }
    goto LAB_001cd85a;
  }
  if (iVar9 == 4) {
    uVar7 = (long)(int)IVar6 % GA[lVar1].num_blocks[0];
    local_108[0] = (int)uVar7;
    if (1 < (short)uVar2) {
      uVar7 = uVar7 & 0xffffffff;
      lVar15 = 0;
      IVar8 = IVar6;
      do {
        IVar8 = (long)((int)IVar8 - (int)uVar7) / GA[g_a + 1000].num_blocks[lVar15];
        uVar7 = (long)(int)IVar8 % GA[g_a + 1000].num_blocks[lVar15 + 1];
        local_108[lVar15 + 1] = (int)uVar7;
        lVar15 = lVar15 + 1;
      } while ((uVar12 & 0xffffffff) - 1 != lVar15);
    }
    if (0 < (short)uVar2) {
      pCVar4 = GA[lVar1].mapc;
      lVar15 = 0;
      iVar9 = 0;
      do {
        iVar3 = *(int *)((long)local_108 + lVar15);
        lVar10 = (long)iVar9 + (long)iVar3;
        *(C_Integer *)((long)local_a8 + lVar15 * 2) = pCVar4[lVar10];
        if ((long)iVar3 < *(long *)((long)GA[lVar1].num_blocks + lVar15 * 2) + -1) {
          lVar10 = GA[lVar1].mapc[lVar10 + 1] + -1;
        }
        else {
          lVar10 = *(long *)((long)GA[lVar1].dims + lVar15 * 2);
        }
        *(long *)((long)local_e8 + lVar15 * 2) = lVar10;
        iVar9 = iVar9 + *(int *)((long)GA[lVar1].num_blocks + lVar15 * 2);
        lVar15 = lVar15 + 4;
      } while ((uVar12 & 0xffffffff) << 2 != lVar15);
    }
    goto LAB_001cd85a;
  }
  if (iVar9 != 0) goto LAB_001cd85a;
  if (GA[lVar1].num_rstrctd == 0) {
    if ((short)uVar2 < 1) {
      lVar15 = 1;
    }
    else {
      lVar15 = 1;
      uVar7 = 0;
      do {
        lVar15 = lVar15 * GA[g_a + 1000].nblock[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar12 != uVar7);
    }
    if ((-1 < IVar6) && (IVar6 < lVar15)) {
      if (0 < (short)uVar2) {
        pCVar4 = GA[lVar1].mapc;
        uVar7 = 0;
        lVar15 = 0;
        IVar8 = IVar6;
        do {
          lVar13 = (long)GA[g_a + 1000].nblock[uVar7];
          lVar10 = IVar8 % lVar13;
          local_a8[uVar7] = pCVar4[lVar10 + lVar15];
          if (lVar10 == lVar13 + -1) {
            CVar11 = GA[g_a + 1000].dims[uVar7];
          }
          else {
            CVar11 = pCVar4[lVar10 + lVar15 + 1] + -1;
          }
          lVar15 = lVar15 + lVar13;
          local_e8[uVar7] = CVar11;
          uVar7 = uVar7 + 1;
          IVar8 = IVar8 / lVar13;
        } while (uVar12 != uVar7);
      }
      goto LAB_001cd85a;
    }
LAB_001cd821:
    if ((short)uVar2 < 1) goto LAB_001cd85a;
    memset(local_a8,0,uVar12 << 3);
  }
  else {
    if (IVar6 < GA[lVar1].num_rstrctd) {
      if ((short)uVar2 < 1) {
        lVar15 = 1;
      }
      else {
        lVar15 = 1;
        uVar7 = 0;
        do {
          lVar15 = lVar15 * GA[g_a + 1000].nblock[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar12 != uVar7);
      }
      if ((-1 < IVar6) && (IVar6 < lVar15)) {
        if (0 < (short)uVar2) {
          pCVar4 = GA[lVar1].mapc;
          lVar15 = 0;
          uVar7 = 0;
          IVar8 = IVar6;
          do {
            lVar13 = (long)GA[g_a + 1000].nblock[uVar7];
            lVar10 = IVar8 % lVar13;
            local_a8[uVar7] = pCVar4[lVar10 + lVar15];
            if (lVar10 == lVar13 + -1) {
              CVar11 = GA[g_a + 1000].dims[uVar7];
            }
            else {
              CVar11 = pCVar4[lVar10 + lVar15 + 1] + -1;
            }
            lVar15 = lVar15 + lVar13;
            local_e8[uVar7] = CVar11;
            uVar7 = uVar7 + 1;
            IVar8 = IVar8 / lVar13;
          } while (uVar12 != uVar7);
        }
        goto LAB_001cd85a;
      }
      goto LAB_001cd821;
    }
    if ((short)uVar2 < 1) goto LAB_001cd85a;
    memset(local_a8,0,(ulong)uVar2 << 3);
  }
  memset(local_e8,0xff,uVar12 << 3);
LAB_001cd85a:
  if (uVar12 == 1) {
    *ld = (local_e8[0] - local_a8[0]) + pgVar5[lVar1].width[0] * 2 + 1;
  }
  if ((short)uVar2 < 2) {
    lVar15 = 1;
    lVar10 = 0;
  }
  else {
    lVar15 = 1;
    lVar13 = 0;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + alStack_70[lVar13 + 1] * lVar15;
      lVar14 = (local_e8[lVar13] - local_a8[lVar13]) + pgVar5[g_a + 1000].width[lVar13] * 2 + 1;
      ld[lVar13] = lVar14;
      lVar15 = lVar15 * lVar14;
      lVar13 = lVar13 + 1;
    } while (uVar12 - 1 != lVar13);
  }
  *(char **)ptr =
       pgVar5[lVar1].ptr[IVar6] +
       (long)pgVar5[lVar1].elemsize * (lVar15 * alStack_70[uVar12] + lVar10);
  return;
}

Assistant:

void pnga_access_ghost_element_ptr(Integer g_a, void *ptr, 
                        Integer subscript[], Integer ld[]) 
{ 
  char *lptr; 
  Integer  handle = GA_OFFSET + g_a; 
  Integer i; 
  Integer tmp_sub[MAXDIM]; 
  Integer me = pnga_nodeid(); 
  /* Indices conform to Fortran convention. Shift them down 1 so that 
     gam_LocationWithGhosts works. */ 
  for (i=0; i<GA[handle].ndim; i++) tmp_sub[i] = subscript[i] - 1; 
  gam_LocationWithGhosts(me, handle, tmp_sub, &lptr, ld); 
 
  *(char**)ptr = lptr; 
}